

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O0

void __thiscall
wallet::init_tests::walletinit_verify_walletdir_does_not_exist::test_method
          (walletinit_verify_walletdir_does_not_exist *this)

{
  long lVar1;
  undefined1 uVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  pointer pWVar4;
  char *in_RDI;
  long in_FS_OFFSET;
  bool result;
  DebugLogHelper debugloghelper6;
  DebugLogHelper *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  key_type *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 *line_num;
  const_string *file;
  allocator<char> *in_stack_fffffffffffffe88;
  string *message;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  const_string local_140 [2];
  lazy_ostream local_120 [2];
  assertion_result local_100 [2];
  undefined1 local_c0 [24];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x488);
  message = (string *)&stack0xffffffffffffff67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,in_stack_fffffffffffffe88);
  __a = (allocator<char> *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe68);
  InitWalletDirTestingSetup::SetWalletDir
            ((InitWalletDirTestingSetup *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
             (path *)in_stack_fffffffffffffe68);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe48->m_message);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  file = (const_string *)&stack0xffffffffffffff66;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,__a);
  line_num = local_c0;
  std::function<bool(std::__cxx11::string_const*)>::
  function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
            ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
              *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  DebugLogHelper::DebugLogHelper
            ((DebugLogHelper *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),message
             ,(MatchFn *)this_00);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
               *)in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe48->m_message);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff66);
  pWVar4 = std::unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
           ::operator->((unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
                         *)in_stack_fffffffffffffe48);
  iVar3 = (*(pWVar4->super_ChainClient)._vptr_ChainClient[3])();
  uVar2 = (undefined1)iVar3;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               (pointer)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (unsigned_long)in_stack_fffffffffffffe48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,file,(size_t)line_num,
               (const_string *)CONCAT17(uVar2,in_stack_fffffffffffffe70));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               (bool)in_stack_fffffffffffffe57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               (pointer)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (unsigned_long)in_stack_fffffffffffffe48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               (pointer)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (unsigned_long)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe48 = (DebugLogHelper *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_100,local_120,local_140,0x2a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffe48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe5f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe5f);
  DebugLogHelper::~DebugLogHelper(in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_does_not_exist)
{
    SetWalletDir(m_walletdir_path_cases["nonexistent"]);
    {
        ASSERT_DEBUG_LOG("does not exist");
        bool result = m_wallet_loader->verify();
        BOOST_CHECK(result == false);
    }
}